

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

bool cimg_library::cimg::is_directory(char *path)

{
  int iVar1;
  bool local_a9;
  undefined1 local_a8 [8];
  stat st_buf;
  char *path_local;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    path_local._7_1_ = false;
  }
  else {
    st_buf.__glibc_reserved[2] = (__syscall_slong_t)path;
    iVar1 = stat(path,(stat *)local_a8);
    local_a9 = iVar1 == 0 && ((uint)st_buf.st_nlink & 0xf000) == 0x4000;
    path_local._7_1_ = local_a9;
  }
  return path_local._7_1_;
}

Assistant:

inline bool is_directory(const char *const path) {
      if (!path || !*path) return false;
#if cimg_OS==1
      struct stat st_buf;
      return (!stat(path,&st_buf) && S_ISDIR(st_buf.st_mode));
#elif cimg_OS==2
      const unsigned int res = (unsigned int)GetFileAttributesA(path);
      return res==INVALID_FILE_ATTRIBUTES?false:(res&16);
#else
      return false;
#endif
    }